

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

VertexDataDesc * vkt::pipeline::multisample::getVertexDataDescriptonNdc(void)

{
  VertexDataDesc *in_RDI;
  VkVertexInputAttributeDescription vertexAttribPositionNdc;
  value_type local_28;
  
  (in_RDI->vertexAttribDescVec).
  super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->vertexAttribDescVec).
  super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->vertexAttribDescVec).
  super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI->dataStride = 0x10;
  in_RDI->dataSize = 0x40;
  in_RDI->primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  in_RDI->verticesCount = 4;
  local_28.location = 0;
  local_28.binding = 0;
  local_28.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_28.offset = 0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::push_back(&in_RDI->vertexAttribDescVec,&local_28);
  return in_RDI;
}

Assistant:

MultisampleInstanceBase::VertexDataDesc getVertexDataDescriptonNdc (void)
{
	MultisampleInstanceBase::VertexDataDesc vertexDataDesc;

	vertexDataDesc.verticesCount	 = 4u;
	vertexDataDesc.dataStride		 = sizeof(VertexDataNdc);
	vertexDataDesc.dataSize			 = vertexDataDesc.verticesCount * vertexDataDesc.dataStride;
	vertexDataDesc.primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

	const VkVertexInputAttributeDescription vertexAttribPositionNdc =
	{
		0u,											// deUint32	location;
		0u,											// deUint32	binding;
		VK_FORMAT_R32G32B32A32_SFLOAT,				// VkFormat	format;
		DE_OFFSET_OF(VertexDataNdc, positionNdc),	// deUint32	offset;
	};

	vertexDataDesc.vertexAttribDescVec.push_back(vertexAttribPositionNdc);

	return vertexDataDesc;
}